

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O3

void __thiscall google::protobuf::util::converter::JsonObjectWriter::NewLine(JsonObjectWriter *this)

{
  size_type sVar1;
  CodedOutputStream *this_00;
  pointer data;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint8 *puVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar5;
  
  sVar1 = (this->indent_string_)._M_string_length;
  if (sVar1 != 0) {
    iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
    if (0 < this->indent_count_) {
      sVar5 = sVar1 * (long)*(int *)(CONCAT44(extraout_var,iVar2) + 0x10);
      puVar4 = io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
                         (&this->stream_->impl_,(int)sVar5 + 1,&this->stream_->cur_);
      if (puVar4 != (uint8 *)0x0) {
        *puVar4 = '\n';
        memset(puVar4 + 1,*(int *)&this->indent_char_,sVar5);
        return;
      }
    }
    WriteChar(this,'\n');
    iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                      (this);
    if (0 < *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x10)) {
      iVar2 = 0;
      do {
        this_00 = this->stream_;
        data = (this->indent_string_)._M_dataplus._M_p;
        puVar4 = this_00->cur_;
        iVar3 = (int)(this->indent_string_)._M_string_length;
        sVar5 = (size_t)iVar3;
        if ((long)(this_00->impl_).end_ - (long)puVar4 < (long)sVar5) {
          puVar4 = io::EpsCopyOutputStream::WriteRawFallback(&this_00->impl_,data,iVar3,puVar4);
        }
        else {
          memcpy(puVar4,data,sVar5);
          puVar4 = puVar4 + sVar5;
        }
        this_00->cur_ = puVar4;
        iVar2 = iVar2 + 1;
        iVar3 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])
                          (this);
      } while (iVar2 < *(int *)(CONCAT44(extraout_var_01,iVar3) + 0x10));
    }
  }
  return;
}

Assistant:

void NewLine() {
    if (!indent_string_.empty()) {
      size_t len = sizeof('\n') + (indent_string_.size() * element()->level());

      // Take the slow-path if we don't have sufficient characters remaining in
      // our buffer or we have a non-trivial indent string which would prevent
      // us from using memset.
      uint8* out = nullptr;
      if (indent_count_ > 0) {
        out = stream_->GetDirectBufferForNBytesAndAdvance(len);
      }

      if (out != nullptr) {
        out[0] = '\n';
        memset(&out[1], indent_char_, len - 1);
      } else {
        // Slow path, no contiguous output buffer available.
        WriteChar('\n');
        for (int i = 0; i < element()->level(); i++) {
          stream_->WriteRaw(indent_string_.c_str(), indent_string_.length());
        }
      }
    }
  }